

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Disequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int aiVar1 [2];
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int aiVar6 [2];
  DdNode *g;
  DdNode *h;
  byte bVar7;
  int local_e0;
  int local_dc;
  int newIndex [2];
  DdNode *newMap [2];
  int iStack_c0;
  int j;
  DdNode *fminus;
  DdNode *fequal;
  DdNode *fplus;
  DdNode *g1;
  DdNode *g0;
  int rightChild;
  int middleChild;
  int leftChild;
  int kTrueUbLower;
  int kTrueLbLower;
  int index [2];
  int invalidIndex;
  DdNode *map [2];
  DdNode *zero;
  DdNode *one;
  DdNode *f;
  uint local_40;
  int i;
  int mask;
  int kFalse;
  int kTrueUb;
  int kTrueLb;
  DdNode **y_local;
  DdNode **x_local;
  int c_local;
  int N_local;
  DdManager *dd_local;
  
  local_40 = 1;
  one = (DdNode *)0x0;
  aiVar1 = (int  [2])dd->one;
  aiVar6 = (int  [2])((ulong)aiVar1 ^ 1);
  memset(index + 1,0,0x10);
  bVar2 = (byte)N;
  kTrueUbLower = 1 << (bVar2 - 1 & 0x1f);
  if (N < 0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    dd_local = (DdManager *)aiVar1;
    if (N == 0) {
      dd_local = (DdManager *)aiVar6;
      if (c != 0) {
        dd_local = (DdManager *)aiVar1;
      }
    }
    else if ((c <= (1 << (bVar2 & 0x1f)) + -1) && (1 - (1 << (bVar2 & 0x1f)) <= c)) {
      kTrueLbLower = kTrueUbLower;
      index[0] = kTrueUbLower;
      mask = c + -1;
      kFalse = c + 1;
      for (f._4_4_ = 1; f._4_4_ <= N; f._4_4_ = f._4_4_ + 1) {
        memset(newIndex,0,0x10);
        bVar7 = (byte)f._4_4_;
        iVar3 = (c + -1 >> (bVar7 & 0x1f)) + 2;
        iVar4 = (c + 1 >> (bVar7 & 0x1f)) + (uint)((c + 2U & local_40) != 1);
        local_40 = local_40 << 1 | 1;
        local_e0 = index[0];
        local_dc = index[0];
        for (newMap[1]._4_4_ = iVar4 + -1; newMap[1]._4_4_ < iVar3;
            newMap[1]._4_4_ = newMap[1]._4_4_ + 1) {
          if ((newMap[1]._4_4_ < 1 << (bVar2 - bVar7 & 0x1f)) &&
             (-(1 << (bVar2 - bVar7 & 0x1f)) < newMap[1]._4_4_)) {
            iVar5 = newMap[1]._4_4_ * 2 + -1;
            _iStack_c0 = aiVar1;
            if (((iVar5 < kFalse) && (mask < iVar5)) &&
               ((f._4_4_ != 1 || (_iStack_c0 = aiVar6, iVar5 != c)))) {
              if ((iVar5 != kTrueUbLower) && (iVar5 != kTrueLbLower)) {
                __assert_fail("leftChild == index[0] || leftChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x3ed,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kTrueUbLower) {
                iStack_c0 = index[1];
                j = invalidIndex;
              }
              else {
                _iStack_c0 = (int  [2])map[0];
              }
            }
            iVar5 = newMap[1]._4_4_ << 1;
            fminus = (DdNode *)aiVar1;
            if (((iVar5 < kFalse) && (mask < iVar5)) &&
               ((f._4_4_ != 1 || (fminus = (DdNode *)aiVar6, iVar5 != c)))) {
              if ((iVar5 != kTrueUbLower) && (iVar5 != kTrueLbLower)) {
                __assert_fail("middleChild == index[0] || middleChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x3fc,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kTrueUbLower) {
                fminus = (DdNode *)stack0xffffffffffffff88;
              }
              else {
                fminus = map[0];
              }
            }
            iVar5 = newMap[1]._4_4_ * 2 + 1;
            fequal = (DdNode *)aiVar1;
            if (((iVar5 < kFalse) && (mask < iVar5)) &&
               ((f._4_4_ != 1 || (fequal = (DdNode *)aiVar6, iVar5 != c)))) {
              if ((iVar5 != kTrueUbLower) && (iVar5 != kTrueLbLower)) {
                __assert_fail("rightChild == index[0] || rightChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x40b,
                              "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kTrueUbLower) {
                fequal = (DdNode *)stack0xffffffffffffff88;
              }
              else {
                fequal = map[0];
              }
            }
            g = Cudd_bddIte(dd,y[N - f._4_4_],fminus,fequal);
            if (g == (DdNode *)0x0) {
              if (kTrueUbLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff88);
              }
              if (kTrueLbLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_e0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_dc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
            h = Cudd_bddIte(dd,y[N - f._4_4_],(DdNode *)_iStack_c0,fminus);
            if (h == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,g);
              if (kTrueUbLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff88);
              }
              if (kTrueLbLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_e0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_dc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
            one = Cudd_bddIte(dd,x[N - f._4_4_],g,h);
            if ((int  [2])one == (int  [2])0x0) {
              Cudd_IterDerefBdd(dd,g);
              Cudd_IterDerefBdd(dd,h);
              if (kTrueUbLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff88);
              }
              if (kTrueLbLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_e0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_dc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
            Cudd_IterDerefBdd(dd,g);
            Cudd_IterDerefBdd(dd,h);
            if ((local_e0 != index[0]) && (local_dc != index[0])) {
              __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                            ,0x436,
                            "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)")
              ;
            }
            if (local_e0 == index[0]) {
              local_e0 = newMap[1]._4_4_;
              newIndex = (int  [2])one;
            }
            else {
              local_dc = newMap[1]._4_4_;
              newMap[0] = one;
            }
          }
        }
        if (kTrueUbLower != index[0]) {
          Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff88);
        }
        if (kTrueLbLower != index[0]) {
          Cudd_IterDerefBdd(dd,map[0]);
        }
        index[1] = newIndex[0];
        invalidIndex = newIndex[1];
        map[0] = newMap[0];
        kTrueUbLower = local_e0;
        kTrueLbLower = local_dc;
        mask = iVar4 + -2;
        kFalse = iVar3;
      }
      *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + -1;
      dd_local = (DdManager *)one;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Disequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrueLb = c + 1;
    int kTrueUb = c - 1;
    int kFalse = c;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c != 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c || (-(1 << N) + 1) > c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLbLower, kTrueUbLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLbLower = kTrueLb;
        kTrueUbLower = kTrueUb;
        /* kTrueLb = floor((c-1)/2^i) + 2 */
        kTrueLb = ((c-1) >> i) + 2;
        /* kTrueUb = ceiling((c+1)/2^i) - 2 */
        kTrueUb = ((c+1) >> i) + (((c+2) & mask) != 1) - 2;
        mask = (mask << 1) | 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kTrueUb + 1; j < kTrueLb; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLbLower || leftChild <= kTrueUbLower) {
                fminus = one;
            } else if (i == 1 && leftChild == kFalse) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLbLower || middleChild <= kTrueUbLower) {
                fequal = one;
            } else if (i == 1 && middleChild == kFalse) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLbLower || rightChild <= kTrueUbLower) {
                fplus = one;
            } else if (i == 1 && rightChild == kFalse) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}